

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtaptestlogger.cpp
# Opt level: O0

void __thiscall
QTapTestLogger::addIncident
          (QTapTestLogger *this,IncidentTypes type,char *description,char *file,int line)

{
  QLatin1StringView key;
  QLatin1StringView key_00;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  QTapTestLogger *this_00;
  QTapTestLogger *pQVar7;
  QTestCharBuffer *in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  char *pcVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  QByteArrayView QVar11;
  QLatin1StringView QVar12;
  OperationType opType;
  char *indent;
  char *incident;
  bool ok;
  bool isExpectedFail;
  size_t RuntimeThreshold;
  size_t i;
  size_t RuntimeThreshold_5;
  size_t RuntimeThreshold_3;
  size_t RuntimeThreshold_1;
  size_t i_1;
  size_t i_3;
  size_t i_5;
  size_t RuntimeThreshold_4;
  size_t RuntimeThreshold_2;
  size_t i_2;
  size_t i_4;
  ComparisonInfo info;
  QString actualExpression;
  anon_class_8_1_a847c8e5 parenthesize;
  QString actual;
  QString expected;
  QLatin1StringView comparisonType;
  QString message_1;
  QRegularExpressionMatch match;
  QString descriptionString;
  QTestCharBuffer location;
  QTestCharBuffer unparsableDescription;
  QTestCharBuffer diagnosticsYamlish;
  QTestCharBuffer message;
  QTestCharBuffer directive;
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString> *in_stack_ffffffffffffec38;
  QTapTestLogger *in_stack_ffffffffffffec40;
  QTestCharBuffer *in_stack_ffffffffffffec48;
  QTapTestLogger *pQVar13;
  QTapTestLogger *in_stack_ffffffffffffec50;
  QTestCharBuffer *in_stack_ffffffffffffec58;
  QTestCharBuffer *in_stack_ffffffffffffec60;
  anon_class_8_1_a847c8e5 *in_stack_ffffffffffffec78;
  QTestCharBuffer *in_stack_ffffffffffffec88;
  undefined8 in_stack_ffffffffffffec90;
  QTapTestLogger *in_stack_ffffffffffffec98;
  QTestCharBuffer *this_01;
  QString *in_stack_ffffffffffffecc8;
  anon_class_1_0_00000001 *in_stack_ffffffffffffecd0;
  qsizetype in_stack_ffffffffffffed00;
  char *in_stack_ffffffffffffed08;
  bool local_1171;
  int local_112c;
  ulong local_1078;
  ulong local_1030;
  ulong local_1018;
  ulong local_1000;
  ulong local_fc8;
  ulong local_fb0;
  undefined1 local_f10 [120];
  undefined1 local_e98 [168];
  qsizetype local_df0;
  char *local_de8;
  ComparisonInfo local_dd8;
  undefined1 local_db0 [120];
  undefined1 local_d38 [96];
  QLatin1StringView local_cd8;
  QLatin1StringView local_cb0;
  undefined1 local_c60 [104];
  QLatin1StringView local_bf8;
  undefined1 *local_be8;
  undefined1 *puStack_be0;
  undefined1 *local_bd8;
  undefined1 **local_bd0;
  QString local_bc8;
  QString local_ba8;
  QLatin1String local_b88 [2];
  QString local_b60;
  undefined4 local_b44;
  QRegularExpressionMatch local_b40 [12];
  undefined4 local_b34;
  QRegularExpressionMatch local_b30 [12];
  undefined4 local_b24;
  undefined1 *local_b20;
  storage_type *local_b18;
  undefined1 *local_b08;
  undefined1 *puStack_b00;
  undefined1 *local_af8;
  uint local_ae4;
  undefined1 local_ae0 [28];
  uint local_ac4;
  undefined1 local_ac0 [28];
  uint local_aa4;
  undefined1 local_aa0 [28];
  anon_class_4_1_89923c38 local_a84;
  char *local_a80;
  QTestCharBuffer local_a78;
  QTestCharBuffer local_868;
  QTestCharBuffer local_658;
  QTestCharBuffer local_448;
  QTestCharBuffer local_238;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = in_ESI == 2;
  bVar10 = in_ESI == 8;
  local_1171 = bVar9 || bVar10;
  local_a80 = in_RDX;
  bVar1 = QTestCharBuffer::isEmpty((QTestCharBuffer *)(in_RDI + 0x10));
  bVar3 = false;
  if ((((bVar1) && (bVar3 = true, in_ESI != 1)) && (bVar3 = true, in_ESI != 5)) &&
     ((bVar3 = true, in_ESI != 0 && (bVar3 = true, in_ESI != 4)))) {
    bVar3 = in_ESI == 7;
  }
  pcVar5 = QTestCharBuffer::constData((QTestCharBuffer *)(in_RDI + 0x10));
  pcVar5 = addIncident::anon_class_4_1_89923c38::operator()(&local_a84,pcVar5);
  memset(&local_238,0xaa,0x210);
  QTestCharBuffer::QTestCharBuffer(&local_238);
  if (pcVar5 != (char *)0x0) {
    pcVar6 = " # ";
    if (bVar9 || bVar10) {
      pcVar6 = "";
    }
    bVar1 = false;
    if (local_a80 != (char *)0x0) {
      bVar1 = *local_a80 != '\0';
    }
    pcVar8 = "";
    if (bVar1) {
      pcVar8 = " ";
    }
    QTest::qt_asprintf(&local_238,"%s%s%s%s",pcVar6,pcVar5,pcVar8,local_a80);
  }
  if (local_1171) {
    if (((*(byte *)(in_RDI + 0x640) & 1) != 0) &&
       (bVar1 = QTestCharBuffer::isEmpty((QTestCharBuffer *)(in_RDI + 0x10)), bVar1)) {
      QTestPrivate::appendCharBuffer(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0x640) = 0;
    QTestLog::totalCount();
    outputTestLine(in_stack_ffffffffffffec98,SUB81((ulong)in_stack_ffffffffffffec90 >> 0x38,0),
                   (int)in_stack_ffffffffffffec90,in_stack_ffffffffffffec88);
  }
  flushComments(in_stack_ffffffffffffec40);
  if (bVar3) {
    bVar1 = QTestCharBuffer::isEmpty((QTestCharBuffer *)(in_RDI + 0x430));
    if (bVar1) goto LAB_0013f846;
  }
  if (bVar9 || bVar10) {
    memset(&local_448,0xaa,0x210);
    QTestCharBuffer::QTestCharBuffer(&local_448);
    if ((*(byte *)(in_RDI + 0x640) & 1) == 0) {
      pcVar6 = QTestCharBuffer::constData(&local_238);
      QTest::qt_asprintf(&local_448,"  # xfail:%s\n",pcVar6 + 4);
    }
    else {
      pcVar6 = QTestCharBuffer::constData(&local_238);
      QTest::qt_asprintf(&local_448,"    - severity: xfail\n      message:%s\n",pcVar6 + 4);
    }
    outputBuffer(in_stack_ffffffffffffec50,in_stack_ffffffffffffec48);
    QTestCharBuffer::~QTestCharBuffer((QTestCharBuffer *)in_stack_ffffffffffffec40);
  }
  else {
    beginYamlish((QTapTestLogger *)0x13dc06);
  }
  if ((!bVar9 && !bVar10) || ((*(byte *)(in_RDI + 0x640) & 1) != 0)) {
    this_00 = (QTapTestLogger *)0x1b7352;
    if (bVar9 || bVar10) {
      this_00 = (QTapTestLogger *)0x1b734e;
    }
    if (!bVar3) {
      if ((addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::verifyRegex
           == '\0') &&
         (iVar4 = __cxa_guard_acquire(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                                       ::verifyRegex), iVar4 != 0)) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)in_stack_ffffffffffffec58,(size_t)in_stack_ffffffffffffec50);
        QFlags<QRegularExpression::PatternOption>::QFlags
                  ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffec40,
                   (PatternOption)((ulong)in_stack_ffffffffffffec38 >> 0x20));
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    verifyRegex,(QString *)local_aa0,(QFlags_conflict *)(ulong)local_aa4);
        QString::~QString((QString *)0x13dcd7);
        __cxa_atexit(QRegularExpression::~QRegularExpression,
                     &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                      verifyRegex,&__dso_handle);
        __cxa_guard_release(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::verifyRegex);
      }
      if ((addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::compareRegex
           == '\0') &&
         (iVar4 = __cxa_guard_acquire(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                                       ::compareRegex), iVar4 != 0)) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)in_stack_ffffffffffffec58,(size_t)in_stack_ffffffffffffec50);
        QFlags<QRegularExpression::PatternOption>::QFlags
                  ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffec40,
                   (PatternOption)((ulong)in_stack_ffffffffffffec38 >> 0x20));
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    compareRegex,(QString *)local_ac0,(QFlags_conflict *)(ulong)local_ac4);
        QString::~QString((QString *)0x13dd79);
        __cxa_atexit(QRegularExpression::~QRegularExpression,
                     &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                      compareRegex,&__dso_handle);
        __cxa_guard_release(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::compareRegex);
      }
      if ((addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
           compareOpRegex == '\0') &&
         (iVar4 = __cxa_guard_acquire(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                                       ::compareOpRegex), iVar4 != 0)) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)in_stack_ffffffffffffec58,(size_t)in_stack_ffffffffffffec50);
        QFlags<QRegularExpression::PatternOption>::QFlags
                  ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffec40,
                   (PatternOption)((ulong)in_stack_ffffffffffffec38 >> 0x20));
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    compareOpRegex,(QString *)local_ae0,(QFlags_conflict *)(ulong)local_ae4);
        QString::~QString((QString *)0x13de1b);
        __cxa_atexit(QRegularExpression::~QRegularExpression,
                     &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                      compareOpRegex,&__dso_handle);
        __cxa_guard_release(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::compareOpRegex);
      }
      local_b08 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_b00 = &DAT_aaaaaaaaaaaaaaaa;
      local_af8 = &DAT_aaaaaaaaaaaaaaaa;
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)in_stack_ffffffffffffec50,(char **)in_stack_ffffffffffffec48);
      QVar11.m_data = local_b18;
      QVar11.m_size = (qsizetype)&local_b08;
      QString::fromUtf8(QVar11);
      local_b20 = &DAT_aaaaaaaaaaaaaaaa;
      QFlags<QRegularExpression::MatchOption>::QFlags
                ((QFlags<QRegularExpression::MatchOption> *)in_stack_ffffffffffffec40,
                 (MatchOption)((ulong)in_stack_ffffffffffffec38 >> 0x20));
      QRegularExpression::match
                (&local_b20,
                 &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                  verifyRegex,&local_b08,0,0,local_b24);
      local_112c = 0;
      bVar2 = QRegularExpressionMatch::hasMatch();
      if ((bVar2 & 1) != 0) {
        local_112c = 2;
      }
      if (local_112c == 0) {
        QFlags<QRegularExpression::MatchOption>::QFlags
                  ((QFlags<QRegularExpression::MatchOption> *)in_stack_ffffffffffffec40,
                   (MatchOption)((ulong)in_stack_ffffffffffffec38 >> 0x20));
        QRegularExpression::match
                  (local_b30,
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    compareRegex,&local_b08,0,0,local_b34);
        QRegularExpressionMatch::operator=
                  ((QRegularExpressionMatch *)in_stack_ffffffffffffec40,
                   (QRegularExpressionMatch *)in_stack_ffffffffffffec38);
        QRegularExpressionMatch::~QRegularExpressionMatch(local_b30);
        bVar2 = QRegularExpressionMatch::hasMatch();
        if ((bVar2 & 1) != 0) {
          local_112c = 1;
        }
      }
      if (local_112c == 0) {
        QFlags<QRegularExpression::MatchOption>::QFlags
                  ((QFlags<QRegularExpression::MatchOption> *)in_stack_ffffffffffffec40,
                   (MatchOption)((ulong)in_stack_ffffffffffffec38 >> 0x20));
        QRegularExpression::match
                  (local_b40,
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    compareOpRegex,&local_b08,0,0,local_b44);
        QRegularExpressionMatch::operator=
                  ((QRegularExpressionMatch *)in_stack_ffffffffffffec40,
                   (QRegularExpressionMatch *)in_stack_ffffffffffffec38);
        QRegularExpressionMatch::~QRegularExpressionMatch(local_b40);
        bVar2 = QRegularExpressionMatch::hasMatch();
        if ((bVar2 & 1) != 0) {
          local_112c = 3;
        }
      }
      if (local_112c == 0) {
        if ((local_a80 != (char *)0x0) && (pcVar5 == (char *)0x0)) {
          memset(&local_868,0xaa,0x210);
          QTestCharBuffer::QTestCharBuffer(&local_868);
          QTest::qt_asprintf(&local_868,"  # %s\n",local_a80);
          outputBuffer(in_stack_ffffffffffffec50,in_stack_ffffffffffffec48);
          QTestCharBuffer::~QTestCharBuffer((QTestCharBuffer *)in_stack_ffffffffffffec40);
        }
      }
      else {
        local_b60.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_b60.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_b60.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        std::data<char16_t_const,8ul>((char16_t (*) [8])L"message");
        for (local_1078 = 0; (local_1078 < 8 && (L"message"[local_1078] != L'\0'));
            local_1078 = local_1078 + 1) {
        }
        QAnyStringView::QAnyStringView<char16_t,_true>
                  ((QAnyStringView *)in_stack_ffffffffffffec50,(char16_t *)in_stack_ffffffffffffec48
                   ,(qsizetype)in_stack_ffffffffffffec40);
        QRegularExpressionMatch::captured((QAnyStringView *)&local_b60);
        local_b88[0].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_b88[0].m_data = &DAT_aaaaaaaaaaaaaaaa;
        QLatin1String::QLatin1String(local_b88);
        local_ba8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_ba8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_ba8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x13e33d);
        local_bc8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_bc8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_bc8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x13e369);
        local_bd0 = &local_b20;
        local_bd8 = &DAT_aaaaaaaaaaaaaaaa;
        local_be8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_be0 = &DAT_aaaaaaaaaaaaaaaa;
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_ffffffffffffec48,(size_t)in_stack_ffffffffffffec40);
        QVar12.m_data = in_stack_ffffffffffffed08;
        QVar12.m_size = in_stack_ffffffffffffed00;
        addIncident::anon_class_8_1_a847c8e5::operator()(in_stack_ffffffffffffec78,QVar12);
        if (local_112c == 2) {
          local_bf8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_ffffffffffffec48,(size_t)in_stack_ffffffffffffec40
                                );
          local_b88[0].m_size = local_bf8.m_size;
          local_b88[0].m_data = local_bf8.m_data;
          std::data<char16_t_const,7ul>((char16_t (*) [7])L"actual");
          for (local_1030 = 0; (local_1030 < 7 && (L"actual"[local_1030] != L'\0'));
              local_1030 = local_1030 + 1) {
          }
          QAnyStringView::QAnyStringView<char16_t,_true>
                    ((QAnyStringView *)in_stack_ffffffffffffec50,
                     (char16_t *)in_stack_ffffffffffffec48,(qsizetype)in_stack_ffffffffffffec40);
          QRegularExpressionMatch::captured((QAnyStringView *)local_c60);
          QString::toLower((QString *)in_stack_ffffffffffffec38);
          ::operator%((QString *)in_stack_ffffffffffffec48,(QString *)in_stack_ffffffffffffec40);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString,_const_QString_&> *)in_stack_ffffffffffffec38);
          QString::operator=((QString *)in_stack_ffffffffffffec40,
                             (QString *)in_stack_ffffffffffffec38);
          QString::~QString((QString *)0x13e5de);
          QStringBuilder<QString,_const_QString_&>::~QStringBuilder
                    ((QStringBuilder<QString,_const_QString_&> *)0x13e5eb);
          QString::~QString((QString *)0x13e5f8);
          QString::~QString((QString *)0x13e605);
          QVar12 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)in_stack_ffffffffffffec48,(size_t)in_stack_ffffffffffffec40);
          bVar2 = QString::startsWith((QLatin1String *)&local_bc8,(CaseSensitivity)QVar12.m_size);
          if ((bVar2 & 1) == 0) {
            local_cb0 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_ffffffffffffec48,
                                   (size_t)in_stack_ffffffffffffec40);
          }
          else {
            local_cb0 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_ffffffffffffec48,
                                   (size_t)in_stack_ffffffffffffec40);
          }
          ::operator%((QLatin1String *)in_stack_ffffffffffffec40,
                      (QString *)in_stack_ffffffffffffec38);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QLatin1String,_const_QString_&> *)in_stack_ffffffffffffec38);
          QString::operator=((QString *)in_stack_ffffffffffffec40,
                             (QString *)in_stack_ffffffffffffec38);
          QString::~QString((QString *)0x13e6fa);
          bVar3 = QString::isEmpty((QString *)0x13e707);
          if (bVar3) {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)in_stack_ffffffffffffec58,(size_t)in_stack_ffffffffffffec50);
            QString::operator=((QString *)in_stack_ffffffffffffec40,
                               (QString *)in_stack_ffffffffffffec38);
            QString::~QString((QString *)0x13e74b);
          }
        }
        else if (local_112c == 1) {
          local_cd8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_ffffffffffffec48,(size_t)in_stack_ffffffffffffec40
                                );
          local_b88[0].m_size = local_cd8.m_size;
          local_b88[0].m_data = local_cd8.m_data;
          std::data<char16_t_const,9ul>((char16_t (*) [9])L"expected");
          for (local_fc8 = 0; (local_fc8 < 9 && (L"expected"[local_fc8] != L'\0'));
              local_fc8 = local_fc8 + 1) {
          }
          QAnyStringView::QAnyStringView<char16_t,_true>
                    ((QAnyStringView *)in_stack_ffffffffffffec50,
                     (char16_t *)in_stack_ffffffffffffec48,(qsizetype)in_stack_ffffffffffffec40);
          QRegularExpressionMatch::captured((QAnyStringView *)local_d38);
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_ffffffffffffec48,(size_t)in_stack_ffffffffffffec40);
          key.m_data = in_stack_ffffffffffffed08;
          key.m_size = in_stack_ffffffffffffed00;
          addIncident::anon_class_8_1_a847c8e5::operator()(in_stack_ffffffffffffec78,key);
          ::operator%((QString *)in_stack_ffffffffffffec48,(QString *)in_stack_ffffffffffffec40);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString,_QString> *)in_stack_ffffffffffffec38);
          QString::operator=((QString *)in_stack_ffffffffffffec40,
                             (QString *)in_stack_ffffffffffffec38);
          QString::~QString((QString *)0x13ea1e);
          QStringBuilder<QString,_QString>::~QStringBuilder
                    ((QStringBuilder<QString,_QString> *)in_stack_ffffffffffffec40);
          QString::~QString((QString *)0x13ea38);
          QString::~QString((QString *)0x13ea45);
          std::data<char16_t_const,7ul>((char16_t (*) [7])L"actual");
          for (local_1018 = 0; (local_1018 < 7 && (L"actual"[local_1018] != L'\0'));
              local_1018 = local_1018 + 1) {
          }
          QAnyStringView::QAnyStringView<char16_t,_true>
                    ((QAnyStringView *)in_stack_ffffffffffffec50,
                     (char16_t *)in_stack_ffffffffffffec48,(qsizetype)in_stack_ffffffffffffec40);
          QRegularExpressionMatch::captured((QAnyStringView *)local_db0);
          ::operator%((QString *)in_stack_ffffffffffffec48,(QString *)in_stack_ffffffffffffec40);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString,_const_QString_&> *)in_stack_ffffffffffffec38);
          QString::operator=((QString *)in_stack_ffffffffffffec40,
                             (QString *)in_stack_ffffffffffffec38);
          QString::~QString((QString *)0x13ebc5);
          QStringBuilder<QString,_const_QString_&>::~QStringBuilder
                    ((QStringBuilder<QString,_const_QString_&> *)0x13ebd2);
          QString::~QString((QString *)0x13ebdf);
        }
        else {
          local_dd8.comparisonType = &DAT_aaaaaaaaaaaaaaaa;
          local_dd8.comparisonStringOp = &DAT_aaaaaaaaaaaaaaaa;
          local_dd8 = addIncident::anon_class_1_0_00000001::operator()
                                (in_stack_ffffffffffffecd0,in_stack_ffffffffffffecc8);
          QLatin1String::QLatin1String
                    ((QLatin1String *)in_stack_ffffffffffffec50,(char *)in_stack_ffffffffffffec48);
          local_b88[0].m_size = local_df0;
          local_b88[0].m_data = local_de8;
          QLatin1String::QLatin1String
                    ((QLatin1String *)in_stack_ffffffffffffec50,(char *)in_stack_ffffffffffffec48);
          std::data<char16_t_const,9ul>((char16_t (*) [9])L"expected");
          for (local_fb0 = 0; (local_fb0 < 9 && (L"expected"[local_fb0] != L'\0'));
              local_fb0 = local_fb0 + 1) {
          }
          QAnyStringView::QAnyStringView<char16_t,_true>
                    ((QAnyStringView *)in_stack_ffffffffffffec50,
                     (char16_t *)in_stack_ffffffffffffec48,(qsizetype)in_stack_ffffffffffffec40);
          QRegularExpressionMatch::captured((QAnyStringView *)local_e98);
          ::operator%((QLatin1String *)in_stack_ffffffffffffec48,
                      (QString *)in_stack_ffffffffffffec40);
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_ffffffffffffec48,(size_t)in_stack_ffffffffffffec40);
          key_00.m_data = in_stack_ffffffffffffed08;
          key_00.m_size = in_stack_ffffffffffffed00;
          addIncident::anon_class_8_1_a847c8e5::operator()(in_stack_ffffffffffffec78,key_00);
          ::operator%((QStringBuilder<QLatin1String,_QString> *)in_stack_ffffffffffffec48,
                      (QString *)in_stack_ffffffffffffec40);
          ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffec38);
          QString::operator=((QString *)in_stack_ffffffffffffec40,
                             (QString *)in_stack_ffffffffffffec38);
          QString::~QString((QString *)0x13ef34);
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString> *)
                     in_stack_ffffffffffffec40);
          QString::~QString((QString *)0x13ef4e);
          QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                    ((QStringBuilder<QLatin1String,_QString> *)0x13ef5b);
          QString::~QString((QString *)0x13ef68);
          std::data<char16_t_const,7ul>((char16_t (*) [7])L"actual");
          for (local_1000 = 0; (local_1000 < 7 && (L"actual"[local_1000] != L'\0'));
              local_1000 = local_1000 + 1) {
          }
          QAnyStringView::QAnyStringView<char16_t,_true>
                    ((QAnyStringView *)in_stack_ffffffffffffec50,
                     (char16_t *)in_stack_ffffffffffffec48,(qsizetype)in_stack_ffffffffffffec40);
          QRegularExpressionMatch::captured((QAnyStringView *)local_f10);
          ::operator%((QString *)in_stack_ffffffffffffec48,(QString *)in_stack_ffffffffffffec40);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString,_const_QString_&> *)in_stack_ffffffffffffec38);
          QString::operator=((QString *)in_stack_ffffffffffffec40,
                             (QString *)in_stack_ffffffffffffec38);
          QString::~QString((QString *)0x13f0e8);
          QStringBuilder<QString,_const_QString_&>::~QStringBuilder
                    ((QStringBuilder<QString,_const_QString_&> *)0x13f0f5);
          QString::~QString((QString *)0x13f102);
        }
        memset(&local_658,0xaa,0x210);
        QTestCharBuffer::QTestCharBuffer(&local_658);
        pcVar5 = QLatin1String::latin1(local_b88);
        QtPrivate::asString(&local_b60);
        QString::toLocal8Bit((QString *)in_stack_ffffffffffffec58);
        pcVar6 = QByteArray::constData((QByteArray *)0x13f297);
        QtPrivate::asString(&local_ba8);
        QString::toLocal8Bit((QString *)in_stack_ffffffffffffec58);
        in_stack_ffffffffffffec40 = (QTapTestLogger *)QByteArray::constData((QByteArray *)0x13f2ea);
        QtPrivate::asString(&local_bc8);
        QString::toLocal8Bit((QString *)in_stack_ffffffffffffec58);
        pQVar7 = (QTapTestLogger *)QByteArray::constData((QByteArray *)0x13f33d);
        QtPrivate::asString(&local_ba8);
        QString::toLocal8Bit((QString *)in_stack_ffffffffffffec58);
        QByteArray::constData((QByteArray *)0x13f390);
        QtPrivate::asString(&local_bc8);
        QString::toLocal8Bit((QString *)in_stack_ffffffffffffec58);
        QByteArray::constData((QByteArray *)0x13f3f5);
        pQVar13 = this_00;
        QTest::qt_asprintf(&local_658,
                           "%stype: %s\n%smessage: %s\n%swanted: %s\n%sfound: %s\n%sexpected: %s\n%sactual: %s\n"
                           ,this_00,pcVar5,this_00,pcVar6);
        QByteArray::~QByteArray((QByteArray *)0x13f484);
        QByteArray::~QByteArray((QByteArray *)0x13f491);
        QByteArray::~QByteArray((QByteArray *)0x13f49e);
        QByteArray::~QByteArray((QByteArray *)0x13f4ab);
        QByteArray::~QByteArray((QByteArray *)0x13f4b8);
        outputBuffer(pQVar7,(QTestCharBuffer *)pQVar13);
        QTestCharBuffer::~QTestCharBuffer((QTestCharBuffer *)in_stack_ffffffffffffec40);
        QString::~QString((QString *)0x13f4e9);
        QString::~QString((QString *)0x13f4f6);
        QString::~QString((QString *)0x13f503);
        QString::~QString((QString *)0x13f510);
      }
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_b20);
      QString::~QString((QString *)0x13f70b);
    }
    if (in_RCX != (QTestCharBuffer *)0x0) {
      this_01 = &local_a78;
      memset(this_01,0xaa,0x210);
      QTestCharBuffer::QTestCharBuffer(this_01);
      pQVar7 = this_00;
      pcVar5 = QTestResult::currentTestObjectName();
      pcVar6 = QTestResult::currentTestFunction();
      pQVar13 = this_00;
      QTest::qt_asprintf(&local_a78,"%sat: %s::%s() (%s:%d)\n%sfile: %s\n%sline: %d\n",pQVar7,pcVar5
                         ,pcVar6);
      outputBuffer(pQVar13,in_RCX);
      QTestCharBuffer::~QTestCharBuffer((QTestCharBuffer *)this_00);
      in_stack_ffffffffffffec40 = this_00;
    }
  }
  if (!bVar9 && !bVar10) {
    endYamlish(in_stack_ffffffffffffec40);
  }
LAB_0013f846:
  QTestCharBuffer::~QTestCharBuffer((QTestCharBuffer *)in_stack_ffffffffffffec40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTapTestLogger::addIncident(IncidentTypes type, const char *description,
                                 const char *file, int line)
{
    const bool isExpectedFail = type == XFail || type == BlacklistedXFail;
    const bool ok = (m_firstExpectedFail.isEmpty()
                     && (type == Pass || type == BlacklistedPass || type == Skip
                         || type == XPass || type == BlacklistedXPass));

    const char *const incident = [type](const char *priorXFail) {
        switch (type) {
        // We treat expected or blacklisted failures/passes as TODO-failures/passes,
        // which should be treated as soft issues by consumers. Not all do though :/
        case BlacklistedPass:
            if (priorXFail[0] != '\0')
                return priorXFail;
            Q_FALLTHROUGH();
        case XFail: case BlacklistedXFail:
        case XPass: case BlacklistedXPass:
        case BlacklistedFail:
            return "TODO";
        case Skip:
            return "SKIP";
        case Pass:
            if (priorXFail[0] != '\0')
                return priorXFail;
            Q_FALLTHROUGH();
        case Fail:
            break;
        }
        return static_cast<const char *>(nullptr);
    }(m_firstExpectedFail.constData());

    QTestCharBuffer directive;
    if (incident) {
        QTest::qt_asprintf(&directive, "%s%s%s%s",
                           isExpectedFail ? "" : " # ", incident,
                           description && description[0] ? " " : "", description);
    }

    if (!isExpectedFail) {
        m_gatherMessages = false;
        outputTestLine(ok, QTestLog::totalCount(), directive);
    } else if (m_gatherMessages && m_firstExpectedFail.isEmpty()) {
        QTestPrivate::appendCharBuffer(&m_firstExpectedFail, directive);
    }
    flushComments();

    if (!ok || !m_messages.isEmpty()) {
        // All failures need a diagnostics section to not confuse consumers.
        // We also need a diagnostics section when we have messages to report.
        if (isExpectedFail) {
            QTestCharBuffer message;
            if (m_gatherMessages) {
                QTest::qt_asprintf(&message, YAML_INDENT YAML_INDENT "- severity: xfail\n"
                                   YAML_INDENT YAML_INDENT YAML_INDENT "message:%s\n",
                                   directive.constData() + 4);
            } else {
                QTest::qt_asprintf(&message, YAML_INDENT "# xfail:%s\n", directive.constData() + 4);
            }
            outputBuffer(message);
        } else {
            beginYamlish();
        }

        if (!isExpectedFail || m_gatherMessages) {
            const char *indent = isExpectedFail ? YAML_INDENT YAML_INDENT YAML_INDENT : YAML_INDENT;
            if (!ok) {
#if QT_CONFIG(regularexpression)
                enum class OperationType {
                    Unknown,
                    Compare,    /* Plain old QCOMPARE */
                    Verify,     /* QVERIFY */
                    CompareOp,  /* QCOMPARE_OP */
                };

                // This is fragile, but unfortunately testlib doesn't plumb
                // the expected and actual values to the loggers (yet).
                static const QRegularExpression verifyRegex(
                            u"^'(?<actualexpression>.*)' returned "
                            "(?<actual>\\w+)\\. \\((?<message>.*)\\)$"_s);

                static const QRegularExpression compareRegex(
                            u"^(?<message>.*)\n"
                            "\\s*Actual\\s+\\((?<actualexpression>.*)\\)\\s*: (?<actual>.*)\n"
                            "\\s*Expected\\s+\\((?<expectedexpresssion>.*)\\)\\s*: "
                            "(?<expected>.*)$"_s);

                static const QRegularExpression compareOpRegex(
                            u"^(?<message>.*)\n"
                            "\\s*Computed\\s+\\((?<actualexpression>.*)\\)\\s*: (?<actual>.*)\n"
                            "\\s*Baseline\\s+\\((?<expectedexpresssion>.*)\\)\\s*: "
                            "(?<expected>.*)$"_s);

                const QString descriptionString = QString::fromUtf8(description);
                QRegularExpressionMatch match = verifyRegex.match(descriptionString);

                OperationType opType = OperationType::Unknown;
                if (match.hasMatch())
                    opType = OperationType::Verify;

                if (opType == OperationType::Unknown) {
                    match = compareRegex.match(descriptionString);
                    if (match.hasMatch())
                        opType = OperationType::Compare;
                }

                if (opType == OperationType::Unknown) {
                    match = compareOpRegex.match(descriptionString);
                    if (match.hasMatch())
                        opType = OperationType::CompareOp;
                }

                if (opType != OperationType::Unknown) {
                    QString message = match.captured(u"message");
                    QLatin1StringView comparisonType;
                    QString expected;
                    QString actual;
                    const auto parenthesize = [&match](QLatin1StringView key) -> QString {
                        return " ("_L1 % match.captured(key) % u')';
                    };
                    const QString actualExpression = parenthesize("actualexpression"_L1);

                    if (opType == OperationType::Verify) {
                        comparisonType = "QVERIFY"_L1;
                        actual = match.captured(u"actual").toLower() % actualExpression;
                        expected = (actual.startsWith("true "_L1) ? "false"_L1 : "true"_L1)
                                % actualExpression;
                        if (message.isEmpty())
                            message = u"Verification failed"_s;
                    } else if (opType == OperationType::Compare) {
                        comparisonType = "QCOMPARE"_L1;
                        expected = match.captured(u"expected")
                            % parenthesize("expectedexpresssion"_L1);
                        actual = match.captured(u"actual") % actualExpression;
                    } else {
                        struct ComparisonInfo {
                            const char *comparisonType;
                            const char *comparisonStringOp;
                        };
                        // get a proper comparison type based on the error message
                        const auto info = [](const QString &err) -> ComparisonInfo {
                            if (err.contains("different"_L1))
                                return { "QCOMPARE_NE", "!= " };
                            else if (err.contains("less than or equal to"_L1))
                                return { "QCOMPARE_LE", "<= " };
                            else if (err.contains("greater than or equal to"_L1))
                                return { "QCOMPARE_GE", ">= " };
                            else if (err.contains("less than"_L1))
                                return { "QCOMPARE_LT", "< " };
                            else if (err.contains("greater than"_L1))
                                return { "QCOMPARE_GT", "> " };
                            else if (err.contains("to be equal to"_L1))
                                return { "QCOMPARE_EQ", "== " };
                            else
                                return { "Unknown", "" };
                        }(message);
                        comparisonType = QLatin1StringView(info.comparisonType);
                        expected = QLatin1StringView(info.comparisonStringOp)
                                    % match.captured(u"expected")
                                    % parenthesize("expectedexpresssion"_L1);
                        actual = match.captured(u"actual") % actualExpression;
                    }

                    QTestCharBuffer diagnosticsYamlish;
                    QTest::qt_asprintf(&diagnosticsYamlish,
                                       "%stype: %s\n"
                                       "%smessage: %s\n"
                                       // Some consumers understand 'wanted/found', others need
                                       // 'expected/actual', so be compatible with both.
                                       "%swanted: %s\n"
                                       "%sfound: %s\n"
                                       "%sexpected: %s\n"
                                       "%sactual: %s\n",
                                       indent, comparisonType.latin1(),
                                       indent, qPrintable(message),
                                       indent, qPrintable(expected), indent, qPrintable(actual),
                                       indent, qPrintable(expected), indent, qPrintable(actual)
                    );

                    outputBuffer(diagnosticsYamlish);
                } else
#endif
                if (description && !incident) {
                    QTestCharBuffer unparsableDescription;
                    QTest::qt_asprintf(&unparsableDescription, YAML_INDENT "# %s\n", description);
                    outputBuffer(unparsableDescription);
                }
            }

            if (file) {
                QTestCharBuffer location;
                QTest::qt_asprintf(&location,
                                   // The generic 'at' key is understood by most consumers.
                                   "%sat: %s::%s() (%s:%d)\n"

                                   // The file and line keys are for consumers that are able
                                   // to read more granular location info.
                                   "%sfile: %s\n"
                                   "%sline: %d\n",

                                   indent, QTestResult::currentTestObjectName(),
                                   QTestResult::currentTestFunction(),
                                   file, line, indent, file, indent, line
                    );
                outputBuffer(location);
            }
        }

        if (!isExpectedFail)
            endYamlish();
    }
}